

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O1

void CheckWasmMathException(int exceptionCode,ExceptionFilterHelper *helper)

{
  ScriptFunction *this;
  FunctionBody *pFVar1;
  int32 hCode;
  
  if (((exceptionCode & 0xfffffffeU) == 0xc0000094) && (DAT_015aa2df != '\0')) {
    this = ExceptionFilterHelper::GetScriptFunction(helper);
    if (this != (ScriptFunction *)0x0) {
      pFVar1 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
      if ((pFVar1 != (FunctionBody *)0x0) &&
         (((pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) != 0)) {
        hCode = -0x7ff5fffa;
        if (exceptionCode == -0x3fffff6c) {
          hCode = -0x7ff5e49e;
        }
        Js::JavascriptError::ThrowWebAssemblyRuntimeError
                  ((((((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject
                       .super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                   super_JavascriptLibraryBase).scriptContext.ptr,hCode,(PCWSTR)0x0);
      }
    }
  }
  return;
}

Assistant:

void CheckWasmMathException(int exceptionCode, ExceptionFilterHelper& helper)
    {
        if (CONFIG_FLAG(WasmMathExFilter) && (exceptionCode == STATUS_INTEGER_DIVIDE_BY_ZERO || exceptionCode == STATUS_INTEGER_OVERFLOW))
        {
            Js::ScriptFunction* func = helper.GetScriptFunction();
            if (func)
            {
                Js::FunctionBody* funcBody = func->GetFunctionBody();
                if (funcBody && funcBody->IsWasmFunction())
                {
                    int32 code = exceptionCode == STATUS_INTEGER_DIVIDE_BY_ZERO ? WASMERR_DivideByZero : VBSERR_Overflow;
                    JavascriptError::ThrowWebAssemblyRuntimeError(func->GetScriptContext(), code);
                }
            }
        }
    }